

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O0

bool death_prog_inner_guardian(CHAR_DATA *mob,CHAR_DATA *killer)

{
  OBJ_DATA *pOVar1;
  bool bVar2;
  long in_RDI;
  CHAR_DATA *cabalguardian;
  bool found;
  char buf [4608];
  OBJ_DATA *obj_next;
  OBJ_DATA *obj;
  CHAR_DATA *in_stack_ffffffffffffedc8;
  undefined7 in_stack_ffffffffffffedd0;
  byte bVar3;
  CHAR_DATA *in_stack_ffffffffffffedd8;
  undefined4 in_stack_ffffffffffffede0;
  int in_stack_ffffffffffffede4;
  OBJ_DATA *in_stack_ffffffffffffedf0;
  OBJ_DATA *local_18;
  
  do_cb((CHAR_DATA *)buf._176_8_,(char *)buf._168_8_);
  pOVar1 = *(OBJ_DATA **)(in_RDI + 0x98);
  while (local_18 = pOVar1, local_18 != (OBJ_DATA *)0x0) {
    bVar3 = 0;
    pOVar1 = local_18->next_content;
    bVar2 = isCabalItem(local_18);
    if (bVar2) {
      if ((local_18->pIndexData->cabal != *(short *)(in_RDI + 0x132)) &&
         (in_stack_ffffffffffffedc8 =
               get_cabal_guardian((int)((ulong)in_stack_ffffffffffffedc8 >> 0x20)),
         in_stack_ffffffffffffedc8 != (CHAR_DATA *)0x0)) {
        sprintf(&stack0xffffffffffffedd8,"As %s falls, %s returns to %s!",
                *(undefined8 *)(in_RDI + 0x108),local_18->short_descr,
                in_stack_ffffffffffffedc8->short_descr);
        obj_from_char(in_stack_ffffffffffffedf0);
        obj_to_char((OBJ_DATA *)CONCAT17(bVar3,in_stack_ffffffffffffedd0),in_stack_ffffffffffffedc8)
        ;
        bVar3 = 1;
        act((char *)CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
            in_stack_ffffffffffffedd8,(void *)CONCAT17(1,in_stack_ffffffffffffedd0),
            in_stack_ffffffffffffedc8,0);
        cabal_shudder(in_stack_ffffffffffffede4,SUB41((uint)in_stack_ffffffffffffede0 >> 0x18,0));
      }
      save_cabal_items();
      if ((local_18->pIndexData->cabal == *(short *)(in_RDI + 0x132)) || ((bVar3 & 1) == 0)) {
        act((char *)CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
            in_stack_ffffffffffffedd8,(void *)CONCAT17(bVar3,in_stack_ffffffffffffedd0),
            in_stack_ffffffffffffedc8,0);
        act((char *)CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
            in_stack_ffffffffffffedd8,(void *)CONCAT17(bVar3,in_stack_ffffffffffffedd0),
            in_stack_ffffffffffffedc8,0);
        local_18->timer = 0x15;
        obj_from_char(in_stack_ffffffffffffedf0);
        obj_to_char((OBJ_DATA *)CONCAT17(bVar3,in_stack_ffffffffffffedd0),in_stack_ffffffffffffedc8)
        ;
      }
    }
  }
  return false;
}

Assistant:

bool death_prog_inner_guardian(CHAR_DATA *mob, CHAR_DATA *killer)
{
	OBJ_DATA *obj, *obj_next;
	char buf[MSL];
	bool found= false;
	CHAR_DATA *cabalguardian;

	do_cb(mob, "Alas, my life has come to an end.");

	for (obj = mob->carrying; obj != nullptr; obj = obj_next)
	{
		found= false;
		obj_next = obj->next_content;

		if (!isCabalItem(obj))
			continue;

		if (obj->pIndexData->cabal != mob->cabal)
		{
			cabalguardian = get_cabal_guardian(obj->pIndexData->cabal);
			if (cabalguardian)
			{
				sprintf(buf, "As %s falls, %s returns to %s!",
					mob->short_descr,
					obj->short_descr,
					cabalguardian->short_descr);

				obj_from_char(obj);
				obj_to_char(obj, cabalguardian);

				found = true;

				act(buf, mob, 0, 0, TO_ALL);
				cabal_shudder(obj->pIndexData->cabal, false);
			}
		}

		save_cabal_items();

		if (obj->pIndexData->cabal == mob->cabal || !found)
		{
			act("As $N falls, $p appears in $n's hands!", killer, obj, mob, TO_ROOM);
			act("As $N falls, $p appears in your hands!", killer, obj, mob, TO_CHAR);

			obj->timer = 21;

			obj_from_char(obj);
			obj_to_char(obj, killer);
		}
	}

	return false;
}